

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_EncryptFinal
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pEncryptedData,
          CK_ULONG_PTR pulEncryptedDataLen)

{
  int iVar1;
  Session *this_00;
  SymmetricAlgorithm *pSVar2;
  long in_RCX;
  long in_RDI;
  Session *session;
  CK_ULONG_PTR in_stack_000000b8;
  CK_BYTE_PTR in_stack_000000c0;
  Session *in_stack_000000c8;
  undefined8 local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else {
    this_00 = (Session *)
              HandleManager::getSession
                        ((HandleManager *)pEncryptedData,(CK_SESSION_HANDLE)pulEncryptedDataLen);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else if (in_RCX == 0) {
      Session::resetOp(this_00);
      local_8 = 7;
    }
    else {
      iVar1 = Session::getOpType(this_00);
      if (iVar1 == 2) {
        pSVar2 = Session::getSymmetricCryptoOp(this_00);
        if (pSVar2 == (SymmetricAlgorithm *)0x0) {
          local_8 = 0x54;
        }
        else {
          local_8 = SymEncryptFinal(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
        }
      }
      else {
        local_8 = 0x91;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_EncryptFinal(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pEncryptedData, CK_ULONG_PTR pulEncryptedDataLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Github issue #469, check NULL_PTR on pulEncryptedDataLen
	if (pulEncryptedDataLen == NULL)
	{
		session->resetOp();
		return CKR_ARGUMENTS_BAD;
	}

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_ENCRYPT) return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getSymmetricCryptoOp() != NULL)
		return SymEncryptFinal(session, pEncryptedData, pulEncryptedDataLen);
	else
		return CKR_FUNCTION_NOT_SUPPORTED;
}